

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O3

int format_decimal(int64_t v,char *p,int s)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong __n;
  int iVar4;
  int __c;
  char *__src;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  if (v < 0) {
    iVar4 = -1;
    if (s < 1) {
      return -1;
    }
    __n = (ulong)(uint)s;
    __c = 0x30;
  }
  else {
    __n = (ulong)(uint)s;
    pcVar1 = p + __n;
    __src = pcVar1;
    lVar2 = 0;
    uVar7 = s;
    do {
      uVar6 = uVar7;
      lVar5 = lVar2;
      uVar3 = v;
      __src[-1] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
      __src = __src + -1;
      uVar7 = uVar6 - 1;
      if ((int)uVar6 < 2) break;
      v = uVar3 / 10;
      lVar2 = lVar5 + 1;
    } while (9 < uVar3);
    if (uVar3 < 10) {
      memmove(p,__src,(long)(int)(s - uVar7));
      iVar4 = 0;
      if ((int)uVar6 < 2) {
        return 0;
      }
      __n = (ulong)(s - 1) - lVar5;
      __c = 0x20;
      p = pcVar1 + -(ulong)uVar7;
    }
    else {
      iVar4 = -1;
      if (s < 1) {
        return -1;
      }
      __c = 0x39;
      p = __src;
    }
  }
  memset(p,__c,__n);
  return iVar4;
}

Assistant:

static int
format_decimal(int64_t v, char *p, int s)
{
	int len;
	char *h;

	len = s;
	h = p;

	/* Negative values in ar header are meaningless, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;
	do {
		*--p = (char)('0' + (v % 10));
		v /= 10;
	} while (--s > 0 && v > 0);

	if (v == 0) {
		memmove(h, p, len - s);
		p = h + len - s;
		while (s-- > 0)
			*p++ = ' ';
		return (0);
	}
	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '9';

	return (-1);
}